

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall Assimp::LWO::AnimResolver::ExtractBindPose(AnimResolver *this,aiMatrix4x4 *out)

{
  float __x;
  float fVar1;
  float fVar2;
  float fVar3;
  float __x_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  aiMatrix4x4t<float> temp_1;
  aiMatrix4x4t<float> temp_2;
  aiMatrix4x4t<float> temp_3;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 rz;
  aiMatrix4x4 ry;
  aiMatrix4x4 rx;
  aiMatrix4x4 s;
  aiMatrix4x4t<float> local_238;
  aiMatrix4x4t<float> local_1f8;
  aiMatrix4x4t<float> local_1b8;
  aiMatrix4x4t<float> local_170;
  aiMatrix4x4t<float> local_130;
  aiMatrix4x4t<float> local_f0;
  aiMatrix4x4t<float> local_b0;
  aiMatrix4x4t<float> local_70;
  
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next != (_List_node_base *)this->envelopes) {
    fVar7 = 0.0;
    fVar1 = 0.0;
    if (this->trans_x != (Envelope *)0x0) {
      fVar1 = ((this->trans_x->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    if (this->trans_y != (Envelope *)0x0) {
      fVar7 = ((this->trans_y->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar3 = 0.0;
    fVar2 = 0.0;
    if (this->trans_z != (Envelope *)0x0) {
      fVar2 = ((this->trans_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_x != (Envelope *)0x0) {
      fVar3 = ((this->rotat_x->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    __x = 0.0;
    __x_00 = 0.0;
    if (this->rotat_y != (Envelope *)0x0) {
      __x_00 = ((this->rotat_y->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_z != (Envelope *)0x0) {
      __x = ((this->rotat_z->keys).
             super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
             super__Vector_impl_data._M_start)->value;
    }
    fVar4 = 1.0;
    fVar5 = 1.0;
    if (this->scale_x != (Envelope *)0x0) {
      fVar5 = ((this->scale_x->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar6 = 1.0;
    if (this->scale_y != (Envelope *)0x0) {
      fVar6 = ((this->scale_y->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    if (this->scale_z != (Envelope *)0x0) {
      fVar4 = ((this->scale_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    local_130.a3 = 0.0;
    local_130.a4 = 0.0;
    local_130.b3 = 0.0;
    local_130.b4 = 0.0;
    local_130.c1 = 0.0;
    local_130.c2 = 0.0;
    local_130.c3 = 1.0;
    local_130.c4 = 0.0;
    local_130.d1 = 0.0;
    local_130.d2 = 0.0;
    local_130.d3 = 0.0;
    local_130.d4 = 1.0;
    local_130.a1 = cosf(__x);
    local_130.b2 = local_130.a1;
    local_130.b1 = sinf(__x);
    local_b0.a1 = 1.0;
    local_b0.a2 = 0.0;
    local_b0.a3 = 0.0;
    local_b0.a4 = 0.0;
    local_b0.b1 = 0.0;
    local_b0.b4 = 0.0;
    local_b0.c1 = 0.0;
    local_130.a2 = -local_130.b1;
    local_b0.c4 = 0.0;
    local_b0.d1 = 0.0;
    local_b0.d2 = 0.0;
    local_b0.d3 = 0.0;
    local_b0.d4 = 1.0;
    local_b0.b2 = cosf(__x_00);
    local_b0.c3 = local_b0.b2;
    local_b0.c2 = sinf(__x_00);
    local_b0.b3 = -local_b0.c2;
    local_f0.a2 = 0.0;
    local_f0.a3 = 0.0;
    local_f0.a4 = 0.0;
    local_f0.b1 = 0.0;
    local_f0.b2 = 1.0;
    local_f0.b3 = 0.0;
    local_f0.b4 = 0.0;
    local_f0.c1 = 0.0;
    local_f0.c2 = 0.0;
    local_f0.c4 = 0.0;
    local_f0.d1 = 0.0;
    local_f0.d2 = 0.0;
    local_f0.d3 = 0.0;
    local_f0.d4 = 1.0;
    local_f0.a1 = cosf(fVar3);
    local_f0.c3 = local_f0.a1;
    fVar3 = sinf(fVar3);
    local_f0.a3 = fVar3;
    local_f0._32_8_ = CONCAT44(local_f0.c2,fVar3) ^ 0x80000000;
    local_70.a2 = 0.0;
    local_70.a3 = 0.0;
    local_70.a4 = 0.0;
    local_70.b1 = 0.0;
    local_70.b3 = 0.0;
    local_70.b4 = 0.0;
    local_70.c1 = 0.0;
    local_70.c2 = 0.0;
    local_70.c4 = 0.0;
    local_70.d1 = 0.0;
    local_70.d2 = 0.0;
    local_70.d3 = 0.0;
    local_70.d4 = 1.0;
    local_170.a1 = 1.0;
    local_170.a2 = 0.0;
    local_170.a3 = 0.0;
    local_170.b1 = 0.0;
    local_170.b2 = 1.0;
    local_170.b3 = 0.0;
    local_170.c1 = 0.0;
    local_170.c2 = 0.0;
    local_170.c3 = 1.0;
    local_170.d3 = 0.0;
    local_170.d4 = 1.0;
    local_170.d1 = 0.0;
    local_170.d2 = 0.0;
    local_170.a4 = fVar1;
    local_170.b4 = fVar7;
    local_170.c4 = fVar2;
    local_70.a1 = fVar5;
    local_70.b2 = fVar6;
    local_70.c3 = fVar4;
    aiMatrix4x4t<float>::operator*=(&local_170,&local_f0);
    local_238.a2 = local_170.a2;
    local_238.a1 = local_170.a1;
    local_238.a4 = local_170.a4;
    local_238.a3 = local_170.a3;
    local_238.b4 = local_170.b4;
    local_238.b3 = local_170.b3;
    local_238.c4 = local_170.c4;
    local_238.c3 = local_170.c3;
    local_238.b1 = local_170.b1;
    local_238.b2 = local_170.b2;
    local_238.c1 = local_170.c1;
    local_238.c2 = local_170.c2;
    local_238.d1 = local_170.d1;
    local_238.d2 = local_170.d2;
    local_238.d3 = local_170.d3;
    local_238.d4 = local_170.d4;
    aiMatrix4x4t<float>::operator*=(&local_238,&local_b0);
    local_1f8.a1 = local_238.a1;
    local_1f8.a2 = local_238.a2;
    local_1f8.a3 = local_238.a3;
    local_1f8.a4 = local_238.a4;
    local_1f8.b1 = local_238.b1;
    local_1f8.b2 = local_238.b2;
    local_1f8.b3 = local_238.b3;
    local_1f8.b4 = local_238.b4;
    local_1f8.c1 = local_238.c1;
    local_1f8.c2 = local_238.c2;
    local_1f8.c3 = local_238.c3;
    local_1f8.c4 = local_238.c4;
    local_1f8.d1 = local_238.d1;
    local_1f8.d2 = local_238.d2;
    local_1f8.d3 = local_238.d3;
    local_1f8.d4 = local_238.d4;
    aiMatrix4x4t<float>::operator*=(&local_1f8,&local_130);
    local_1b8.a1 = local_1f8.a1;
    local_1b8.a2 = local_1f8.a2;
    local_1b8.a3 = local_1f8.a3;
    local_1b8.a4 = local_1f8.a4;
    local_1b8.b1 = local_1f8.b1;
    local_1b8.b2 = local_1f8.b2;
    local_1b8.b3 = local_1f8.b3;
    local_1b8.b4 = local_1f8.b4;
    local_1b8.c1 = local_1f8.c1;
    local_1b8.c2 = local_1f8.c2;
    local_1b8.c3 = local_1f8.c3;
    local_1b8.c4 = local_1f8.c4;
    local_1b8.d1 = local_1f8.d1;
    local_1b8.d2 = local_1f8.d2;
    local_1b8.d3 = local_1f8.d3;
    local_1b8.d4 = local_1f8.d4;
    aiMatrix4x4t<float>::operator*=(&local_1b8,&local_70);
    out->a1 = local_1b8.a1;
    out->a2 = local_1b8.a2;
    out->a3 = local_1b8.a3;
    out->a4 = local_1b8.a4;
    out->b1 = local_1b8.b1;
    out->b2 = local_1b8.b2;
    out->b3 = local_1b8.b3;
    out->b4 = local_1b8.b4;
    out->c1 = local_1b8.c1;
    out->c2 = local_1b8.c2;
    out->c3 = local_1b8.c3;
    out->c4 = local_1b8.c4;
    out->d1 = local_1b8.d1;
    out->d2 = local_1b8.d2;
    out->d3 = local_1b8.d3;
    out->d4 = local_1b8.d4;
    return;
  }
  out->a1 = 1.0;
  out->a2 = 0.0;
  out->a3 = 0.0;
  out->a4 = 0.0;
  out->b1 = 0.0;
  out->b2 = 1.0;
  out->b3 = 0.0;
  out->b4 = 0.0;
  out->c1 = 0.0;
  out->c2 = 0.0;
  out->c3 = 1.0;
  out->c4 = 0.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  return;
}

Assistant:

void AnimResolver::ExtractBindPose(aiMatrix4x4& out)
{
    // If we have no envelopes, return identity
    if (envelopes.empty()) {
        out = aiMatrix4x4();
        return;
    }
    aiVector3D angles, scaling(1.f,1.f,1.f), translation;

    if (trans_x) translation.x = trans_x->keys[0].value;
    if (trans_y) translation.y = trans_y->keys[0].value;
    if (trans_z) translation.z = trans_z->keys[0].value;

    if (rotat_x) angles.x = rotat_x->keys[0].value;
    if (rotat_y) angles.y = rotat_y->keys[0].value;
    if (rotat_z) angles.z = rotat_z->keys[0].value;

    if (scale_x) scaling.x = scale_x->keys[0].value;
    if (scale_y) scaling.y = scale_y->keys[0].value;
    if (scale_z) scaling.z = scale_z->keys[0].value;

    // build the final matrix
    aiMatrix4x4 s,rx,ry,rz,t;
    aiMatrix4x4::RotationZ(angles.z, rz);
    aiMatrix4x4::RotationX(angles.y, rx);
    aiMatrix4x4::RotationY(angles.x, ry);
    aiMatrix4x4::Translation(translation,t);
    aiMatrix4x4::Scaling(scaling,s);
    out = t*ry*rx*rz*s;
}